

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,KeyData *key,string *arg)

{
  bool bVar1;
  SchnorrPubkey local_130;
  ExtPubkey local_118;
  ExtPrivkey local_a8;
  byte local_2e;
  allocator local_2d [13];
  string *local_20;
  string *arg_local;
  KeyData *key_local;
  DescriptorKeyReference *this_local;
  
  this->key_type_ = kDescriptorKeyPublic;
  local_20 = arg;
  arg_local = (string *)key;
  key_local = (KeyData *)this;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  KeyData::GetPubkey(&this->pubkey_,(KeyData *)arg_local);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_,(KeyData *)arg_local);
  local_2e = 0;
  if (local_20 == (string *)0x0) {
    ::std::allocator<char>::allocator();
    local_2e = 1;
    ::std::__cxx11::string::string((string *)&this->argument_,"",local_2d);
  }
  else {
    ::std::__cxx11::string::string((string *)&this->argument_,(string *)local_20);
  }
  if ((local_2e & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  bVar1 = KeyData::HasExtPrivkey(&this->key_data_);
  if (bVar1) {
    KeyData::GetExtPrivkey(&local_a8,&this->key_data_);
    ExtPrivkey::operator=(&this->extprivkey_,&local_a8);
    ExtPrivkey::~ExtPrivkey(&local_a8);
    this->key_type_ = kDescriptorKeyBip32Priv;
  }
  else {
    bVar1 = KeyData::HasExtPubkey(&this->key_data_);
    if (bVar1) {
      KeyData::GetExtPubkey(&local_118,&this->key_data_);
      ExtPubkey::operator=(&this->extpubkey_,&local_118);
      ExtPubkey::~ExtPubkey(&local_118);
      this->key_type_ = kDescriptorKeyBip32;
    }
  }
  SchnorrPubkey::FromPubkey(&local_130,&this->pubkey_,(bool *)0x0);
  SchnorrPubkey::operator=(&this->schnorr_pubkey_,&local_130);
  SchnorrPubkey::~SchnorrPubkey(&local_130);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const KeyData& key, const std::string* arg)
    : key_type_(DescriptorKeyType::kDescriptorKeyPublic),
      pubkey_(key.GetPubkey()),
      key_data_(key),
      argument_((arg) ? *arg : "") {
  if (key_data_.HasExtPrivkey()) {
    extprivkey_ = key_data_.GetExtPrivkey();
    key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
  } else if (key_data_.HasExtPubkey()) {
    extpubkey_ = key_data_.GetExtPubkey();
    key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
  }
  schnorr_pubkey_ = SchnorrPubkey::FromPubkey(pubkey_);
}